

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui4.cpp
# Opt level: O0

ssize_t __thiscall DomSlots::write(DomSlots *this,int __fd,void *__buf,size_t __n)

{
  bool bVar1;
  const_iterator o;
  undefined4 in_register_00000034;
  QString *pQVar2;
  long in_FS_OFFSET;
  QString *v_1;
  QStringList *__range1_1;
  QString *v;
  QStringList *__range1;
  char16_t *str;
  const_iterator __end1_1;
  const_iterator __begin1_1;
  const_iterator __end1;
  const_iterator __begin1;
  DataPointer *in_stack_fffffffffffffe98;
  QArrayDataPointer<char16_t> *in_stack_fffffffffffffea0;
  QString *pQVar3;
  QString *in_stack_fffffffffffffea8;
  QString *str_00;
  QAnyStringView *local_c0;
  const_iterator local_a0 [6];
  QAnyStringView *local_70;
  QString *local_60;
  const_iterator local_58;
  const_iterator local_50;
  QArrayDataPointer<char16_t> local_48 [2];
  long local_8;
  
  pQVar2 = (QString *)CONCAT44(in_register_00000034,__fd);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  str_00 = pQVar2;
  bVar1 = QString::isEmpty((QString *)0x1a2f89);
  if (bVar1) {
    QArrayDataPointer<char16_t>::QArrayDataPointer(local_48,(Data *)0x0,L"slots",5);
    QString::QString((QString *)in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
  }
  else {
    QString::toLower((QString *)in_stack_fffffffffffffe98);
  }
  QAnyStringView::QAnyStringView((QAnyStringView *)this,in_stack_fffffffffffffea8);
  QXmlStreamWriter::writeStartElement((QAnyStringView *)str_00);
  QString::~QString((QString *)0x1a303c);
  if (bVar1) {
    QArrayDataPointer<char16_t>::~QArrayDataPointer(in_stack_fffffffffffffea0);
  }
  local_50.i = (QString *)0xaaaaaaaaaaaaaaaa;
  local_50 = QList<QString>::begin((QList<QString> *)in_stack_fffffffffffffea0);
  local_58.i = (QString *)0xaaaaaaaaaaaaaaaa;
  local_58 = QList<QString>::end((QList<QString> *)in_stack_fffffffffffffea0);
  while( true ) {
    local_60 = local_58.i;
    bVar1 = QList<QString>::const_iterator::operator!=(&local_50,local_58);
    if (!bVar1) break;
    QList<QString>::const_iterator::operator*(&local_50);
    in_stack_fffffffffffffea8 = pQVar2;
    Qt::Literals::StringLiterals::operator____s((char16_t *)str_00,(size_t)this);
    QAnyStringView::QAnyStringView((QAnyStringView *)this,in_stack_fffffffffffffea8);
    QAnyStringView::QAnyStringView((QAnyStringView *)this,in_stack_fffffffffffffea8);
    QXmlStreamWriter::writeTextElement((QAnyStringView *)in_stack_fffffffffffffea8,local_70);
    QString::~QString((QString *)0x1a3181);
    QList<QString>::const_iterator::operator++(&local_50);
  }
  local_a0[0].i = (QString *)0xaaaaaaaaaaaaaaaa;
  local_a0[0] = QList<QString>::begin((QList<QString> *)in_stack_fffffffffffffea0);
  o = QList<QString>::end((QList<QString> *)in_stack_fffffffffffffea0);
  while (bVar1 = QList<QString>::const_iterator::operator!=(local_a0,o), bVar1) {
    QList<QString>::const_iterator::operator*(local_a0);
    pQVar3 = pQVar2;
    Qt::Literals::StringLiterals::operator____s((char16_t *)str_00,(size_t)this);
    QAnyStringView::QAnyStringView((QAnyStringView *)this,in_stack_fffffffffffffea8);
    QAnyStringView::QAnyStringView((QAnyStringView *)this,in_stack_fffffffffffffea8);
    QXmlStreamWriter::writeTextElement((QAnyStringView *)pQVar3,local_c0);
    QString::~QString((QString *)0x1a32c2);
    QList<QString>::const_iterator::operator++(local_a0);
  }
  QXmlStreamWriter::writeEndElement();
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return *(long *)(in_FS_OFFSET + 0x28);
}

Assistant:

void DomSlots::write(QXmlStreamWriter &writer, const QString &tagName) const
{
    writer.writeStartElement(tagName.isEmpty() ? QStringLiteral("slots") : tagName.toLower());

    for (const QString &v : m_signal)
        writer.writeTextElement(u"signal"_s, v);

    for (const QString &v : m_slot)
        writer.writeTextElement(u"slot"_s, v);

    writer.writeEndElement();
}